

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

int history_def_add(void *p,HistEvent *ev,char *str)

{
  long lVar1;
  undefined8 *puVar2;
  size_t __n;
  size_t __n_00;
  void *__dest;
  HistEventPrivate_conflict *evp;
  char *s;
  size_t slen;
  size_t elen;
  size_t len;
  history_t *h;
  char *str_local;
  HistEvent *ev_local;
  void *p_local;
  
  lVar1 = *(long *)((long)p + 0x28);
  if (*(void **)((long)p + 0x28) == p) {
    p_local._4_4_ = history_def_enter(p,ev,str);
  }
  else {
    __n = strlen(*(char **)(lVar1 + 8));
    __n_00 = strlen(str);
    __dest = malloc(__n + __n_00 + 1);
    if (__dest == (void *)0x0) {
      ev->num = 2;
      ev->str = "malloc() failed";
      p_local._4_4_ = -1;
    }
    else {
      memcpy(__dest,*(void **)(lVar1 + 8),__n);
      memcpy((void *)((long)__dest + __n),str,__n_00);
      *(undefined1 *)((long)__dest + __n + __n_00) = 0;
      free(*(void **)(lVar1 + 8));
      *(void **)(lVar1 + 8) = __dest;
      puVar2 = *(undefined8 **)((long)p + 0x28);
      *(undefined8 *)ev = *puVar2;
      ev->str = (char *)puVar2[1];
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int
history_def_add(void *p, TYPE(HistEvent) *ev, const Char *str)
{
	history_t *h = (history_t *) p;
	size_t len, elen, slen;
	Char *s;
	HistEventPrivate *evp = (void *)&h->cursor->ev;

	if (h->cursor == &h->list)
		return history_def_enter(p, ev, str);
	elen = Strlen(evp->str);
	slen = Strlen(str);
	len = elen + slen + 1;
	s = h_malloc(len * sizeof(*s));
	if (s == NULL) {
		he_seterrev(ev, _HE_MALLOC_FAILED);
		return -1;
	}
	memcpy(s, evp->str, elen * sizeof(*s));
	memcpy(s + elen, str, slen * sizeof(*s)); 
        s[len - 1] = '\0';
	h_free(evp->str);
	evp->str = s;
	*ev = h->cursor->ev;
	return 0;
}